

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.h
# Opt level: O1

CustomType<int> * __thiscall
FlatMap<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>,_std::less<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::operator[](FlatMap<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>,_std::less<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *this,CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *key)

{
  int iVar1;
  __normal_iterator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_*,_std::vector<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>,_std::allocator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_>_>_>
  __position;
  tuple<> local_21;
  tuple<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&&>
  local_20;
  
  __position = std::
               __lower_bound<__gnu_cxx::__normal_iterator<std::pair<CustomType<std::__cxx11::string>,CustomType<int>>*,std::vector<std::pair<CustomType<std::__cxx11::string>,CustomType<int>>,std::allocator<std::pair<CustomType<std::__cxx11::string>,CustomType<int>>>>>,CustomType<std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_val<FlatMap<CustomType<std::__cxx11::string>,CustomType<int>,std::less<CustomType<std::__cxx11::string>>>::ValueToKeyComparator>>
                         (*(undefined8 *)this,*(undefined8 *)(this + 8),key);
  if (__position._M_current !=
      *(pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>
        **)(this + 8)) {
    iVar1 = std::__cxx11::string::compare((string *)key);
    if (-1 < iVar1) goto LAB_00197208;
  }
  local_20.
  super__Tuple_impl<0UL,_CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&&>
  .
  super__Head_base<0UL,_CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&&,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&&>
        )(_Tuple_impl<0UL,_CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&&>
          )key;
  __position._M_current =
       (pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>
        *)std::
          vector<std::pair<CustomType<std::__cxx11::string>,CustomType<int>>,std::allocator<std::pair<CustomType<std::__cxx11::string>,CustomType<int>>>>
          ::
          _M_emplace_aux<std::piecewise_construct_t_const&,std::tuple<CustomType<std::__cxx11::string>&&>,std::tuple<>>
                    ((vector<std::pair<CustomType<std::__cxx11::string>,CustomType<int>>,std::allocator<std::pair<CustomType<std::__cxx11::string>,CustomType<int>>>>
                      *)this,__position._M_current,
                     (piecewise_construct_t *)&std::piecewise_construct,&local_20,&local_21);
LAB_00197208:
  return &(__position._M_current)->second;
}

Assistant:

T& operator[](Key&& key) {
        auto pos = std::lower_bound(vec_.begin(), vec_.end(), key, valueToKeyComp_);
        if (pos == vec_.end() || comp_(key, pos->first)) {
            return vec_.emplace(pos, std::piecewise_construct, std::forward_as_tuple(std::move(key)), std::tuple<>())->second;
        } else {
            return pos->second;
        }
    }